

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueStorage.hpp
# Opt level: O0

bool __thiscall
supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::contains
          (KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
          Key<1UL> *key)

{
  bool bVar1;
  undefined8 in_RSI;
  long *in_RDI;
  undefined1 local_20 [32];
  
  (**(code **)(*in_RDI + 8))(local_20,in_RDI,in_RSI);
  bVar1 = std::optional<supermap::ByteArray<1UL>_>::has_value
                    ((optional<supermap::ByteArray<1UL>_> *)0x1411bd);
  std::optional<supermap::ByteArray<1UL>_>::~optional
            ((optional<supermap::ByteArray<1UL>_> *)0x1411cb);
  return bVar1;
}

Assistant:

bool contains(const Key &key) {
        return getValue(key).has_value();
    }